

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3rbu * openRbuHandle(char *zTarget,char *zRbu,char *zState)

{
  char **pzErrMsg;
  sqlite3 *db;
  sqlite3_stmt *psVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  sqlite3rbu *p;
  sqlite3_vfs *psVar5;
  char *pcVar6;
  RbuState *pState;
  Mem *pMem;
  i64 iVar7;
  rbu_file **pprVar8;
  sqlite3rbu *__dest;
  bool bVar9;
  int rnd;
  char zRnd [64];
  uint local_7c;
  sqlite3_stmt *local_78 [9];
  
  if (zTarget == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = strlen(zTarget);
  }
  sVar4 = strlen(zRbu);
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    p = (sqlite3rbu *)sqlite3Malloc(sVar4 + 0x172 + sVar3);
  }
  else {
    p = (sqlite3rbu *)0x0;
  }
  if (p == (sqlite3rbu *)0x0) {
    return (sqlite3rbu *)0x0;
  }
  memset(p,0,0x170);
  sqlite3_randomness(4,&local_7c);
  sqlite3_snprintf(0x40,(char *)local_78,"rbu_vfs_%d",(ulong)local_7c);
  iVar2 = sqlite3rbu_create_vfs((char *)local_78,(char *)0x0);
  p->rc = iVar2;
  if (iVar2 == 0) {
    psVar5 = sqlite3_vfs_find((char *)local_78);
    p->zVfsName = psVar5->zName;
    psVar5[1].pNext = (sqlite3_vfs *)p;
  }
  if (p->rc == 0) {
    __dest = p + 1;
    local_78[0] = (sqlite3_stmt *)((ulong)local_78[0] & 0xffffffff00000000);
    if (zTarget != (char *)0x0) {
      p->zTarget = (char *)__dest;
      memcpy(__dest,zTarget,sVar3 + 1);
      __dest = (sqlite3rbu *)(__dest->zStateDb + (sVar3 - 0x2f));
    }
    p->zRbu = (char *)__dest;
    memcpy(__dest,zRbu,sVar4 + 1);
    if (zState != (char *)0x0) {
      pcVar6 = rbuMPrintf(p,"%s");
      p->zState = pcVar6;
    }
    rbuOpenDatabase(p,(int *)local_78);
    if ((int)local_78[0] != 0) {
      rbuOpenDatabase(p,(int *)0x0);
    }
  }
  if (p->rc == 0) {
    pState = rbuLoadState(p);
    if (p->rc == 0) {
      if (pState->eStage == 0) {
        pcVar6 = rbuMPrintf(p,"%s-oal",p->zTarget);
        if (pcVar6 != (char *)0x0) {
          psVar5 = sqlite3_vfs_find((char *)0x0);
          (*psVar5->xDelete)(psVar5,pcVar6,0);
          sqlite3_free(pcVar6);
        }
        if (p->rc == 0) {
          local_78[0] = (sqlite3_stmt *)0x0;
          p->nPhaseOneStep = -1;
          iVar2 = createFunctionApi(p->dbRbu,"rbu_index_cnt",1,1,p,rbuIndexCntFunc,
                                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                    (_func_void_sqlite3_context_ptr *)0x0,
                                    (_func_void_sqlite3_context_ptr *)0x0,
                                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                    (_func_void_void_ptr *)0x0);
          p->rc = iVar2;
          if (iVar2 == 0) {
            iVar2 = prepareAndCollectError
                              (p->dbRbu,local_78,&p->zErrmsg,
                               "SELECT 1 FROM sqlite_master WHERE tbl_name = \'rbu_count\'");
            p->rc = iVar2;
          }
          psVar1 = local_78[0];
          if (p->rc == 0) {
            iVar2 = sqlite3_step(local_78[0]);
            bVar9 = iVar2 == 100;
            iVar2 = sqlite3_finalize(psVar1);
            p->rc = iVar2;
          }
          else {
            bVar9 = false;
          }
          if ((bVar9) && (p->rc == 0)) {
            iVar2 = prepareAndCollectError
                              (p->dbRbu,local_78,&p->zErrmsg,
                               "SELECT sum(cnt * (1 + rbu_index_cnt(rbu_target_name(tbl))))FROM rbu_count"
                              );
            psVar1 = local_78[0];
            p->rc = iVar2;
            if (iVar2 == 0) {
              iVar2 = sqlite3_step(local_78[0]);
              if (iVar2 == 100) {
                pMem = columnMem(psVar1,0);
                iVar7 = sqlite3VdbeIntValue(pMem);
                columnMallocFailure(psVar1);
                p->nPhaseOneStep = iVar7;
              }
              iVar2 = sqlite3_finalize(psVar1);
              p->rc = iVar2;
            }
          }
        }
        p->eStage = 1;
      }
      else {
        p->eStage = pState->eStage;
        p->nPhaseOneStep = pState->nPhaseOneStep;
      }
      p->nProgress = (int)pState->nProgress;
      p->iOalSz = pState->iOalSz;
    }
  }
  else {
    pState = (RbuState *)0x0;
  }
  if ((p->rc == 0) && (p->pTargetFd->pWalFd != (rbu_file *)0x0)) {
    if (p->eStage == 2) {
      p->eStage = 4;
      p->nStep = 0;
    }
    else if (p->eStage == 1) {
      p->rc = 1;
      pcVar6 = sqlite3_mprintf("cannot update wal mode database");
      p->zErrmsg = pcVar6;
    }
  }
  if (((p->rc == 0) && (p->eStage - 1U < 2)) && (pState->eStage != 0)) {
    pprVar8 = &p->pTargetFd;
    if (p->zTarget == (char *)0x0) {
      pprVar8 = &p->pRbuFd;
    }
    if ((*pprVar8)->iCookie != pState->iCookie) {
      p->rc = 5;
      pcVar6 = "update";
      if (p->zTarget == (char *)0x0) {
        pcVar6 = "vacuum";
      }
      pcVar6 = sqlite3_mprintf("database modified during rbu %s",pcVar6);
      p->zErrmsg = pcVar6;
    }
  }
  if (p->rc == 0) {
    switch(p->eStage) {
    case 1:
      db = p->dbMain;
      pzErrMsg = &p->zErrmsg;
      iVar2 = sqlite3_exec(p->dbRbu,"BEGIN",(sqlite3_callback)0x0,(void *)0x0,pzErrMsg);
      p->rc = iVar2;
      if (iVar2 == 0) {
        iVar2 = rbuObjIterFirst(p,&p->objiter);
        p->rc = iVar2;
      }
      if (p->rc == 0) {
        if ((p->objiter).zTbl == (char *)0x0) {
          p->rc = 0x65;
          p->eStage = 5;
          break;
        }
        if ((pState->eStage == 0) && (p->zTarget == (char *)0x0)) {
          rbuCopyPragma(p,"page_size");
          rbuCopyPragma(p,"auto_vacuum");
        }
      }
      if (p->rc == 0) {
        iVar2 = sqlite3_exec(db,"BEGIN IMMEDIATE",(sqlite3_callback)0x0,(void *)0x0,pzErrMsg);
        p->rc = iVar2;
      }
      if ((p->rc == 0) && (iVar2 = sqlite3_file_control(db,"main",0x19,(void *)0x0), iVar2 == 0)) {
        iVar2 = sqlite3_exec(db,"PRAGMA journal_mode=off",(sqlite3_callback)0x0,(void *)0x0,pzErrMsg
                            );
        p->rc = iVar2;
      }
      if (p->rc == 0) {
        rbuSetupOal(p,pState);
      }
      break;
    case 2:
      break;
    default:
      p->rc = 0xb;
      break;
    case 4:
      rbuSetupCheckpoint(p,pState);
      break;
    case 5:
      p->rc = 0x65;
    }
  }
  rbuFreeState(pState);
  return p;
}

Assistant:

static sqlite3rbu *openRbuHandle(
  const char *zTarget, 
  const char *zRbu,
  const char *zState
){
  sqlite3rbu *p;
  size_t nTarget = zTarget ? strlen(zTarget) : 0;
  size_t nRbu = strlen(zRbu);
  size_t nByte = sizeof(sqlite3rbu) + nTarget+1 + nRbu+1;

  p = (sqlite3rbu*)sqlite3_malloc64(nByte);
  if( p ){
    RbuState *pState = 0;

    /* Create the custom VFS. */
    memset(p, 0, sizeof(sqlite3rbu));
    rbuCreateVfs(p);

    /* Open the target, RBU and state databases */
    if( p->rc==SQLITE_OK ){
      char *pCsr = (char*)&p[1];
      int bRetry = 0;
      if( zTarget ){
        p->zTarget = pCsr;
        memcpy(p->zTarget, zTarget, nTarget+1);
        pCsr += nTarget+1;
      }
      p->zRbu = pCsr;
      memcpy(p->zRbu, zRbu, nRbu+1);
      pCsr += nRbu+1;
      if( zState ){
        p->zState = rbuMPrintf(p, "%s", zState);
      }

      /* If the first attempt to open the database file fails and the bRetry
      ** flag it set, this means that the db was not opened because it seemed
      ** to be a wal-mode db. But, this may have happened due to an earlier
      ** RBU vacuum operation leaving an old wal file in the directory.
      ** If this is the case, it will have been checkpointed and deleted
      ** when the handle was closed and a second attempt to open the 
      ** database may succeed.  */
      rbuOpenDatabase(p, &bRetry);
      if( bRetry ){
        rbuOpenDatabase(p, 0);
      }
    }

    if( p->rc==SQLITE_OK ){
      pState = rbuLoadState(p);
      assert( pState || p->rc!=SQLITE_OK );
      if( p->rc==SQLITE_OK ){

        if( pState->eStage==0 ){ 
          rbuDeleteOalFile(p);
          rbuInitPhaseOneSteps(p);
          p->eStage = RBU_STAGE_OAL;
        }else{
          p->eStage = pState->eStage;
          p->nPhaseOneStep = pState->nPhaseOneStep;
        }
        p->nProgress = pState->nProgress;
        p->iOalSz = pState->iOalSz;
      }
    }
    assert( p->rc!=SQLITE_OK || p->eStage!=0 );

    if( p->rc==SQLITE_OK && p->pTargetFd->pWalFd ){
      if( p->eStage==RBU_STAGE_OAL ){
        p->rc = SQLITE_ERROR;
        p->zErrmsg = sqlite3_mprintf("cannot update wal mode database");
      }else if( p->eStage==RBU_STAGE_MOVE ){
        p->eStage = RBU_STAGE_CKPT;
        p->nStep = 0;
      }
    }

    if( p->rc==SQLITE_OK 
     && (p->eStage==RBU_STAGE_OAL || p->eStage==RBU_STAGE_MOVE)
     && pState->eStage!=0
    ){
      rbu_file *pFd = (rbuIsVacuum(p) ? p->pRbuFd : p->pTargetFd);
      if( pFd->iCookie!=pState->iCookie ){   
        /* At this point (pTargetFd->iCookie) contains the value of the
        ** change-counter cookie (the thing that gets incremented when a 
        ** transaction is committed in rollback mode) currently stored on 
        ** page 1 of the database file. */
        p->rc = SQLITE_BUSY;
        p->zErrmsg = sqlite3_mprintf("database modified during rbu %s",
            (rbuIsVacuum(p) ? "vacuum" : "update")
        );
      }
    }

    if( p->rc==SQLITE_OK ){
      if( p->eStage==RBU_STAGE_OAL ){
        sqlite3 *db = p->dbMain;
        p->rc = sqlite3_exec(p->dbRbu, "BEGIN", 0, 0, &p->zErrmsg);

        /* Point the object iterator at the first object */
        if( p->rc==SQLITE_OK ){
          p->rc = rbuObjIterFirst(p, &p->objiter);
        }

        /* If the RBU database contains no data_xxx tables, declare the RBU
        ** update finished.  */
        if( p->rc==SQLITE_OK && p->objiter.zTbl==0 ){
          p->rc = SQLITE_DONE;
          p->eStage = RBU_STAGE_DONE;
        }else{
          if( p->rc==SQLITE_OK && pState->eStage==0 && rbuIsVacuum(p) ){
            rbuCopyPragma(p, "page_size");
            rbuCopyPragma(p, "auto_vacuum");
          }

          /* Open transactions both databases. The *-oal file is opened or
          ** created at this point. */
          if( p->rc==SQLITE_OK ){
            p->rc = sqlite3_exec(db, "BEGIN IMMEDIATE", 0, 0, &p->zErrmsg);
          }

          /* Check if the main database is a zipvfs db. If it is, set the upper
          ** level pager to use "journal_mode=off". This prevents it from 
          ** generating a large journal using a temp file.  */
          if( p->rc==SQLITE_OK ){
            int frc = sqlite3_file_control(db, "main", SQLITE_FCNTL_ZIPVFS, 0);
            if( frc==SQLITE_OK ){
              p->rc = sqlite3_exec(
                db, "PRAGMA journal_mode=off",0,0,&p->zErrmsg);
            }
          }

          if( p->rc==SQLITE_OK ){
            rbuSetupOal(p, pState);
          }
        }
      }else if( p->eStage==RBU_STAGE_MOVE ){
        /* no-op */
      }else if( p->eStage==RBU_STAGE_CKPT ){
        rbuSetupCheckpoint(p, pState);
      }else if( p->eStage==RBU_STAGE_DONE ){
        p->rc = SQLITE_DONE;
      }else{
        p->rc = SQLITE_CORRUPT;
      }
    }

    rbuFreeState(pState);
  }

  return p;
}